

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceConcatExpr::serializeTo(SequenceConcatExpr *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  AssertionExpr *__n;
  ASTSerializer *in_RSI;
  ASTSerializer *in_RDI;
  SequenceRange *unaff_retaddr;
  Element *elem;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *__range2;
  ASTSerializer *in_stack_ffffffffffffff98;
  ASTSerializer *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
  local_30;
  bool *local_28;
  ASTSerializer *local_10;
  ASTSerializer *serializer_00;
  
  local_10 = in_RSI;
  serializer_00 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
             (char *)in_RDI);
  name._M_str = in_stack_ffffffffffffffc0;
  name._M_len = (size_t)in_stack_ffffffffffffffb8;
  ASTSerializer::startArray(in_stack_ffffffffffffffb0,name);
  local_28 = &in_RDI->includeAddrs;
  local_30._M_current =
       (Element *)
       std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff98);
  std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::end
            ((span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)in_RSI,
                       (__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
    ::operator*(&local_30);
    ASTSerializer::startObject((ASTSerializer *)0x9d21e3);
    in_stack_ffffffffffffff98 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
               (char *)in_RDI);
    __n = not_null<const_slang::ast::AssertionExpr_*>::operator*
                    ((not_null<const_slang::ast::AssertionExpr_*> *)0x9d220b);
    ASTSerializer::write
              (in_stack_ffffffffffffff98,(int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
               (size_t)__n);
    SequenceRange::serializeTo(unaff_retaddr,serializer_00);
    ASTSerializer::endObject((ASTSerializer *)0x9d223a);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0x9d2253);
  return;
}

Assistant:

void SequenceConcatExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("elements");

    for (auto& elem : elements) {
        serializer.startObject();
        serializer.write("sequence", *elem.sequence);
        elem.delay.serializeTo(serializer);
        serializer.endObject();
    }

    serializer.endArray();
}